

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O1

fio_str_info_s * fiobj_data_read2ch(fio_str_info_s *__return_storage_ptr__,FIOBJ io,uint8_t token)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  ulong uVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  ssize_t sVar8;
  int *piVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  bool bVar13;
  
  if (((io == 0) || ((~(uint)io & 6) == 0 || (io & 1) != 0)) ||
     (*(char *)(io & 0xfffffffffffffff8) != '+')) {
    piVar9 = __errno_location();
    *piVar9 = 0xe;
  }
  else if (*(int *)(io + 0x30) == -2) {
    if (*(long *)(io + 0x28) != *(long *)(io + 0x20)) {
      uVar3 = *(undefined8 *)(*(long *)(io + 0x10) + 0x28);
      *(long *)(*(long *)(io + 0x10) + 0x28) = *(long *)(io + 0x28) + *(long *)(io + 0x18);
      fiobj_data_read2ch(__return_storage_ptr__,*(FIOBJ *)(io + 0x10),token);
      *(undefined8 *)(*(long *)(io + 0x10) + 0x28) = uVar3;
      uVar4 = *(ulong *)(io + 0x20);
      if (__return_storage_ptr__->len + *(long *)(io + 0x28) <= uVar4) {
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->len = uVar4 - *(long *)(io + 0x28);
      *(ulong *)(io + 0x28) = uVar4;
      return __return_storage_ptr__;
    }
  }
  else if (*(int *)(io + 0x30) == -1) {
    lVar1 = *(long *)(io + 0x20);
    sVar5 = lVar1 - *(long *)(io + 0x28);
    if (sVar5 != 0) {
      lVar2 = *(long *)(io + 8);
      pcVar12 = (char *)(*(long *)(io + 0x28) + lVar2);
      pvVar6 = memchr(pcVar12,(uint)token,sVar5);
      lVar10 = (long)pvVar6 + 1;
      if (pvVar6 == (void *)0x0) {
        lVar10 = lVar1 + lVar2;
      }
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = lVar10 - (long)pcVar12;
      __return_storage_ptr__->data = pcVar12;
      *(long *)(io + 0x28) = lVar10 - lVar2;
      return __return_storage_ptr__;
    }
  }
  else {
    lVar1 = *(long *)(io + 0x28);
    sVar5 = *(long *)(io + 0x20) - lVar1;
    if (sVar5 != 0) {
      pcVar12 = (char *)(*(long *)(io + 8) + lVar1);
      pvVar6 = memchr(pcVar12,(uint)token,sVar5);
      if (pvVar6 != (void *)0x0) {
        sVar7 = (long)pvVar6 + (1 - (long)pcVar12);
        pcVar11 = (char *)0x0;
        if (sVar7 != 0) {
          pcVar11 = pcVar12;
        }
        *(size_t *)(io + 0x28) = sVar7 + lVar1;
        *(long *)(io + 0x10) = *(long *)(io + 0x10) + sVar7;
        __return_storage_ptr__->capa = 0;
        __return_storage_ptr__->len = sVar7;
        __return_storage_ptr__->data = pcVar11;
        return __return_storage_ptr__;
      }
    }
    *(size_t *)(io + 0x20) = 0;
    *(undefined8 *)(io + 0x28) = 0;
    while( true ) {
      fiobj_data_pre_write(io,0x1000);
      while( true ) {
        sVar8 = pread(*(int *)(io + 0x30),(void *)(*(long *)(io + 8) + *(long *)(io + 0x20)),0x1000,
                      *(long *)(io + 0x20) + *(long *)(io + 0x10));
        if (-1 < sVar8) break;
        piVar9 = __errno_location();
        if (*piVar9 != 4) goto LAB_0011ca2f;
      }
      sVar7 = *(size_t *)(io + 0x20);
      if (sVar8 == 0) break;
      sVar5 = sVar7 + sVar8;
      *(size_t *)(io + 0x20) = sVar5;
      pcVar12 = *(char **)(io + 8);
      if (sVar5 == 0) {
        bVar13 = true;
        pcVar11 = pcVar12;
      }
      else {
        pvVar6 = memchr(pcVar12,(uint)token,sVar5);
        bVar13 = pvVar6 == (void *)0x0;
        pcVar11 = (char *)((long)pvVar6 + 1);
        if (bVar13) {
          pcVar11 = pcVar12 + sVar5;
        }
      }
      if (!bVar13) {
        sVar7 = (long)pcVar11 - (long)(pcVar12 + *(long *)(io + 0x28));
        *(size_t *)(io + 0x28) = sVar7;
        *(long *)(io + 0x10) = *(long *)(io + 0x10) + sVar7;
        __return_storage_ptr__->capa = 0;
        __return_storage_ptr__->len = sVar7;
        __return_storage_ptr__->data = pcVar12;
        return __return_storage_ptr__;
      }
    }
    if (sVar7 != 0) {
      *(long *)(io + 0x10) = *(long *)(io + 0x10) + sVar7;
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = sVar7;
      __return_storage_ptr__->data = *(char **)(io + 8);
      return __return_storage_ptr__;
    }
  }
LAB_0011ca2f:
  __return_storage_ptr__->capa = 0;
  __return_storage_ptr__->len = 0;
  __return_storage_ptr__->data = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

fio_str_info_s fiobj_data_read2ch(FIOBJ io, uint8_t token) {
  if (!io || !FIOBJ_TYPE_IS(io, FIOBJ_T_DATA)) {
    errno = EFAULT;
    return (fio_str_info_s){.data = NULL, .len = 0};
  }
  switch (obj2io(io)->fd) {
  case -1:
    return fiobj_data_read2ch_str(io, token);
    break;
  case -2:
    return fiobj_data_read2ch_slice(io, token);
    break;
  default:
    return fiobj_data_read2ch_file(io, token);
  }
}